

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_util.c
# Opt level: O0

int psa_status_to_mbedtls
              (psa_status_t status,mbedtls_error_pair_t *param_2,size_t param_3,
              _func_int_psa_status_t *fallback_f)

{
  int iVar1;
  ulong local_30;
  size_t i;
  _func_int_psa_status_t *fallback_f_local;
  size_t local_errors_num_local;
  mbedtls_error_pair_t *local_translations_local;
  psa_status_t status_local;
  
  local_30 = 0;
  while( true ) {
    if (param_3 <= local_30) {
      iVar1 = (*fallback_f)(status);
      return iVar1;
    }
    if (status == param_2[local_30].psa_status) break;
    local_30 = local_30 + 1;
  }
  return (int)param_2[local_30].mbedtls_error;
}

Assistant:

int psa_status_to_mbedtls(psa_status_t status,
                          const mbedtls_error_pair_t *local_translations,
                          size_t local_errors_num,
                          int (*fallback_f)(psa_status_t))
{
    for (size_t i = 0; i < local_errors_num; i++) {
        if (status == local_translations[i].psa_status) {
            return local_translations[i].mbedtls_error;
        }
    }
    return fallback_f(status);
}